

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_2::createSubresourceRangeTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,VkImageViewType viewType,
          VkFormat imageFormat)

{
  char *pcVar1;
  VkImageAspectFlags VVar2;
  deUint32 dVar3;
  deBool dVar4;
  TestCaseGroup *this;
  long lVar5;
  ostream *poVar6;
  TestNode *pTVar7;
  ImageViewTest *pIVar8;
  char *pcVar9;
  string local_2708 [32];
  char *pcStack_26e8;
  TestCaseConfig config_17;
  ostringstream desc_17;
  int local_2550;
  int configNdx_17;
  char *pcStack_2528;
  TestCaseConfig config_16;
  ostringstream desc_16;
  int local_238c;
  int configNdx_16;
  TestCaseConfig mipLevelAndArrayRemainingRangeCases_4 [3];
  TestCaseConfig mipLevelRangeCases_4 [2];
  string local_22d8 [32];
  char *pcStack_22b8;
  TestCaseConfig config_15;
  ostringstream desc_15;
  int local_2120;
  int configNdx_15;
  char *pcStack_20f8;
  TestCaseConfig config_14;
  ostringstream desc_14;
  int local_1f60;
  int configNdx_14;
  char *pcStack_1f38;
  TestCaseConfig config_13;
  ostringstream desc_13;
  int local_1da0;
  int configNdx_13;
  char *pcStack_1d78;
  TestCaseConfig config_12;
  ostringstream desc_12;
  int local_1bdc;
  int configNdx_12;
  TestCaseConfig mipLevelAndArrayRemainingRangeCases_3 [3];
  TestCaseConfig mipLevelAndArrayRangeCases_3 [4];
  TestCaseConfig arrayRangeCases_3 [2];
  TestCaseConfig mipLevelRangeCases_3 [2];
  string local_1a68 [32];
  char *pcStack_1a48;
  TestCaseConfig config_11;
  ostringstream desc_11;
  int local_18b0;
  int configNdx_11;
  char *pcStack_1888;
  TestCaseConfig config_10;
  ostringstream desc_10;
  int local_16f0;
  int configNdx_10;
  char *pcStack_16c8;
  TestCaseConfig config_9;
  ostringstream desc_9;
  int local_1530;
  int configNdx_9;
  char *pcStack_1508;
  TestCaseConfig config_8;
  ostringstream desc_8;
  int local_136c;
  int configNdx_8;
  TestCaseConfig mipLevelAndArrayRemainingRangeCases_2 [3];
  TestCaseConfig mipLevelAndArrayRangeCases_2 [4];
  TestCaseConfig arrayRangeCases_2 [2];
  TestCaseConfig mipLevelRangeCases_2 [2];
  string local_11f8 [32];
  char *pcStack_11d8;
  TestCaseConfig config_7;
  ostringstream desc_7;
  int local_1040;
  int configNdx_7;
  char *pcStack_1018;
  TestCaseConfig config_6;
  ostringstream desc_6;
  int local_e80;
  int configNdx_6;
  char *pcStack_e58;
  TestCaseConfig config_5;
  ostringstream desc_5;
  int local_cc0;
  int configNdx_5;
  char *pcStack_c98;
  TestCaseConfig config_4;
  ostringstream desc_4;
  int local_afc;
  int configNdx_4;
  TestCaseConfig mipLevelAndArrayRemainingRangeCases_1 [3];
  TestCaseConfig mipLevelAndArrayRangeCases_1 [6];
  TestCaseConfig arrayRangeCases_1 [3];
  TestCaseConfig mipLevelRangeCases_1 [2];
  string local_928 [32];
  char *pcStack_908;
  TestCaseConfig config_3;
  ostringstream desc_3;
  int local_770;
  int configNdx_3;
  char *pcStack_748;
  TestCaseConfig config_2;
  ostringstream desc_2;
  int local_5b0;
  int configNdx_2;
  char *pcStack_588;
  TestCaseConfig config_1;
  ostringstream desc_1;
  int local_3f0;
  int configNdx_1;
  char *pcStack_3c8;
  TestCaseConfig config;
  ostringstream desc;
  int local_22c;
  int configNdx;
  TestCaseConfig mipLevelAndArrayRemainingRangeCases [3];
  TestCaseConfig mipLevelAndArrayRangeCases [6];
  TestCaseConfig arrayRangeCases [3];
  TestCaseConfig mipLevelRangeCases [2];
  DefaultDeleter<tcu::TestCaseGroup> local_5d [20];
  undefined1 local_49;
  undefined1 auStack_48 [8];
  VkComponentMapping componentMapping;
  VkImageAspectFlags imageAspectFlags;
  deUint32 arraySize;
  deUint32 numLevels;
  VkFormat imageFormat_local;
  VkImageViewType viewType_local;
  TestContext *testCtx_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *rangeTests;
  
  VVar2 = ImageViewTest::getNumLevels(viewType);
  dVar3 = ImageViewTest::getArraySize(viewType);
  auStack_48._0_4_ = VK_COMPONENT_SWIZZLE_R;
  auStack_48._4_4_ = VK_COMPONENT_SWIZZLE_G;
  componentMapping.r = VK_COMPONENT_SWIZZLE_B;
  componentMapping.g = VK_COMPONENT_SWIZZLE_A;
  local_49 = 0;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(this,testCtx,"subresource_range","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_5d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  if ((viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY) || (viewType == VK_IMAGE_VIEW_TYPE_2D_ARRAY)) {
    arrayRangeCases[2].subresourceRange._12_8_ = anon_var_dwarf_3f09cb;
    mipLevelRangeCases[0].name._0_4_ = 0;
    mipLevelRangeCases[0].name._4_4_ = 1;
    mipLevelRangeCases[0].samplerLod = 2.8026e-45;
    mipLevelRangeCases[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelRangeCases[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases[0].subresourceRange._12_8_ = anon_var_dwarf_3f09e2;
    mipLevelRangeCases[1].name._0_4_ = 0x40800000;
    mipLevelRangeCases[1].name._4_4_ = 1;
    mipLevelRangeCases[1].samplerLod = 0.0;
    mipLevelRangeCases[1].subresourceRange.aspectMask = 3;
    mipLevelRangeCases[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[5].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_base_array_layer" + 0x13;
    arrayRangeCases[0].name._0_4_ = 0;
    arrayRangeCases[0].name._4_4_ = 1;
    arrayRangeCases[0].samplerLod = 0.0;
    arrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases[0].subresourceRange.levelCount = dVar3 - 1;
    arrayRangeCases[0].subresourceRange._12_8_ = (long)"lod_base_mip_level_array_size" + 0x13;
    arrayRangeCases[1].name._0_4_ = 0;
    arrayRangeCases[1].name._4_4_ = 1;
    arrayRangeCases[1].samplerLod = 0.0;
    arrayRangeCases[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases[1].subresourceRange.levelCount = 4;
    arrayRangeCases[1].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_base_and_size" + 0x13;
    arrayRangeCases[2].name._0_4_ = 0;
    arrayRangeCases[2].name._4_4_ = 1;
    arrayRangeCases[2].samplerLod = 0.0;
    arrayRangeCases[2].subresourceRange.baseMipLevel = 2;
    arrayRangeCases[2].subresourceRange.levelCount = 3;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange._12_8_ = anon_var_dwarf_3f0a32;
    mipLevelAndArrayRangeCases[0].name._0_4_ = 0;
    mipLevelAndArrayRangeCases[0].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[0].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRangeCases[0].subresourceRange.levelCount = 5;
    mipLevelAndArrayRangeCases[0].subresourceRange._12_8_ = anon_var_dwarf_3f0a49;
    mipLevelAndArrayRangeCases[1].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases[1].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[1].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases[1].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRangeCases[1].subresourceRange.levelCount = 5;
    mipLevelAndArrayRangeCases[1].subresourceRange._12_8_ = anon_var_dwarf_3f0a60;
    mipLevelAndArrayRangeCases[2].name._0_4_ = 0;
    mipLevelAndArrayRangeCases[2].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases[2].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases[2].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[2].subresourceRange.levelCount = 4;
    mipLevelAndArrayRangeCases[2].subresourceRange._12_8_ = anon_var_dwarf_3f0a77;
    mipLevelAndArrayRangeCases[3].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases[3].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[3].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[3].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases[3].subresourceRange.levelCount = 4;
    mipLevelAndArrayRangeCases[3].subresourceRange._12_8_ = anon_var_dwarf_3f0a8e;
    mipLevelAndArrayRangeCases[4].name._0_4_ = 0;
    mipLevelAndArrayRangeCases[4].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[4].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases[4].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases[4].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[4].subresourceRange.levelCount = 3;
    mipLevelAndArrayRangeCases[4].subresourceRange._12_8_ = anon_var_dwarf_3f0aa5;
    mipLevelAndArrayRangeCases[5].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases[5].name._4_4_ = 1;
    mipLevelAndArrayRangeCases[5].samplerLod = 0.0;
    mipLevelAndArrayRangeCases[5].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases[5].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRangeCases[5].subresourceRange.levelCount = 3;
    mipLevelAndArrayRemainingRangeCases[0].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases[0].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases[0].samplerLod = 1.4013e-45;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange._12_8_ = anon_var_dwarf_3f0ac7;
    mipLevelAndArrayRemainingRangeCases[1].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases[1].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange._12_8_ = anon_var_dwarf_3f0ade;
    mipLevelAndArrayRemainingRangeCases[2].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases[2].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.baseMipLevel = 2;
    mipLevelAndArrayRemainingRangeCases[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases[0].subresourceRange.levelCount = dVar3;
    mipLevelAndArrayRemainingRangeCases[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases[0].subresourceRange.aspectMask = VVar2;
    arrayRangeCases[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases[2].subresourceRange.aspectMask = VVar2;
    mipLevelRangeCases[0].subresourceRange.levelCount = dVar3;
    mipLevelRangeCases[1].subresourceRange.levelCount = dVar3;
    do {
      for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_22c;
        pcStack_3c8 = *(char **)&arrayRangeCases[lVar5 + 2].subresourceRange.baseArrayLayer;
        config.name = mipLevelRangeCases[lVar5].name;
        config.samplerLod = mipLevelRangeCases[lVar5].samplerLod;
        config.subresourceRange.aspectMask = mipLevelRangeCases[lVar5].subresourceRange.aspectMask;
        config.subresourceRange.baseMipLevel =
             mipLevelRangeCases[lVar5].subresourceRange.baseMipLevel;
        config.subresourceRange.levelCount = mipLevelRangeCases[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config.subresourceRange.baseArrayLayer,"Samples level "
                                );
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_3c8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_1);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_3f0 = 0; local_3f0 < 3; local_3f0 = local_3f0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_1.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_3f0;
        pcStack_588 = *(char **)&mipLevelAndArrayRangeCases[lVar5 + 5].subresourceRange.
                                 baseArrayLayer;
        config_1.name = arrayRangeCases[lVar5].name;
        config_1.samplerLod = arrayRangeCases[lVar5].samplerLod;
        config_1.subresourceRange.aspectMask = arrayRangeCases[lVar5].subresourceRange.aspectMask;
        config_1.subresourceRange.baseMipLevel =
             arrayRangeCases[lVar5].subresourceRange.baseMipLevel;
        config_1.subresourceRange.levelCount = arrayRangeCases[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_1.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_1.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_1.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_588;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_1.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_1.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_2);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_1.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_5b0 = 0; local_5b0 < 6; local_5b0 = local_5b0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_2.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_5b0;
        pcStack_748 = *(char **)&mipLevelAndArrayRemainingRangeCases[lVar5 + 2].subresourceRange.
                                 baseArrayLayer;
        config_2.name = mipLevelAndArrayRangeCases[lVar5].name;
        config_2.samplerLod = mipLevelAndArrayRangeCases[lVar5].samplerLod;
        config_2.subresourceRange.aspectMask =
             mipLevelAndArrayRangeCases[lVar5].subresourceRange.aspectMask;
        config_2.subresourceRange.baseMipLevel =
             mipLevelAndArrayRangeCases[lVar5].subresourceRange.baseMipLevel;
        config_2.subresourceRange.levelCount =
             mipLevelAndArrayRangeCases[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_2.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_2.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_2.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_748;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_2.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_2.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_3);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_2.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_770 = 0; local_770 < 3; local_770 = local_770 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_3.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_770;
        pcStack_908 = *(char **)&mipLevelAndArrayRemainingRangeCases[lVar5 + -1].subresourceRange.
                                 baseArrayLayer;
        config_3.name = mipLevelAndArrayRemainingRangeCases[lVar5].name;
        config_3.samplerLod = mipLevelAndArrayRemainingRangeCases[lVar5].samplerLod;
        config_3.subresourceRange.aspectMask =
             mipLevelAndArrayRemainingRangeCases[lVar5].subresourceRange.aspectMask;
        config_3.subresourceRange.baseMipLevel =
             mipLevelAndArrayRemainingRangeCases[lVar5].subresourceRange.baseMipLevel;
        config_3.subresourceRange.levelCount =
             mipLevelAndArrayRemainingRangeCases[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_3.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_3.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_3.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_908;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_3.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_3.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string(local_928);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_3.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    arrayRangeCases_1[2].subresourceRange._12_8_ = anon_var_dwarf_3f09cb;
    mipLevelRangeCases_1[0].name._0_4_ = 0;
    mipLevelRangeCases_1[0].name._4_4_ = 1;
    mipLevelRangeCases_1[0].samplerLod = 2.8026e-45;
    mipLevelRangeCases_1[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelRangeCases_1[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_1[0].subresourceRange._12_8_ = anon_var_dwarf_3f09e2;
    mipLevelRangeCases_1[1].name._0_4_ = 0x40800000;
    mipLevelRangeCases_1[1].name._4_4_ = 1;
    mipLevelRangeCases_1[1].samplerLod = 0.0;
    mipLevelRangeCases_1[1].subresourceRange.aspectMask = 3;
    mipLevelRangeCases_1[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases_1[5].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_base_array_layer" + 0x13;
    arrayRangeCases_1[0].name._0_4_ = 0;
    arrayRangeCases_1[0].name._4_4_ = 1;
    arrayRangeCases_1[0].samplerLod = 0.0;
    arrayRangeCases_1[0].subresourceRange.baseMipLevel = 6;
    arrayRangeCases_1[0].subresourceRange.levelCount = dVar3 - 6;
    arrayRangeCases_1[0].subresourceRange._12_8_ = (long)"lod_base_mip_level_array_size" + 0x13;
    arrayRangeCases_1[1].name._0_4_ = 0;
    arrayRangeCases_1[1].name._4_4_ = 1;
    arrayRangeCases_1[1].samplerLod = 0.0;
    arrayRangeCases_1[1].subresourceRange.baseMipLevel = 0;
    arrayRangeCases_1[1].subresourceRange.levelCount = 6;
    arrayRangeCases_1[1].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_base_and_size" + 0x13;
    arrayRangeCases_1[2].name._0_4_ = 0;
    arrayRangeCases_1[2].name._4_4_ = 1;
    arrayRangeCases_1[2].samplerLod = 0.0;
    arrayRangeCases_1[2].subresourceRange.baseMipLevel = 0xc;
    arrayRangeCases_1[2].subresourceRange.levelCount = 6;
    mipLevelAndArrayRemainingRangeCases_1[2].subresourceRange._12_8_ = anon_var_dwarf_3f0a32;
    mipLevelAndArrayRangeCases_1[0].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_1[0].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[0].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_1[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_1[0].subresourceRange.baseMipLevel = 6;
    mipLevelAndArrayRangeCases_1[0].subresourceRange.levelCount = dVar3 - 6;
    mipLevelAndArrayRangeCases_1[0].subresourceRange._12_8_ = anon_var_dwarf_3f0a49;
    mipLevelAndArrayRangeCases_1[1].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_1[1].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_1[1].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_1[1].subresourceRange.baseMipLevel = 6;
    mipLevelAndArrayRangeCases_1[1].subresourceRange.levelCount = dVar3 - 6;
    mipLevelAndArrayRangeCases_1[1].subresourceRange._12_8_ = anon_var_dwarf_3f0a60;
    mipLevelAndArrayRangeCases_1[2].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_1[2].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_1[2].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_1[2].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases_1[2].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_1[2].subresourceRange._12_8_ = anon_var_dwarf_3f0a77;
    mipLevelAndArrayRangeCases_1[3].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_1[3].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[3].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_1[3].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_1[3].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRangeCases_1[3].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_1[3].subresourceRange._12_8_ = anon_var_dwarf_3f0a8e;
    mipLevelAndArrayRangeCases_1[4].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_1[4].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[4].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_1[4].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_1[4].subresourceRange.baseMipLevel = 0xc;
    mipLevelAndArrayRangeCases_1[4].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_1[4].subresourceRange._12_8_ = anon_var_dwarf_3f0aa5;
    mipLevelAndArrayRangeCases_1[5].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_1[5].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_1[5].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_1[5].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_1[5].subresourceRange.baseMipLevel = 0xc;
    mipLevelAndArrayRangeCases_1[5].subresourceRange.levelCount = 6;
    mipLevelAndArrayRemainingRangeCases_1[0].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_1[0].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_1[0].samplerLod = 1.4013e-45;
    mipLevelAndArrayRemainingRangeCases_1[0].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_1[0].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_1[0].subresourceRange._12_8_ = anon_var_dwarf_3f0ac7;
    mipLevelAndArrayRemainingRangeCases_1[1].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_1[1].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_1[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases_1[1].subresourceRange.baseMipLevel = 6;
    mipLevelAndArrayRemainingRangeCases_1[1].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_1[1].subresourceRange._12_8_ = anon_var_dwarf_3f0ade;
    mipLevelAndArrayRemainingRangeCases_1[2].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_1[2].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_1[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRemainingRangeCases_1[2].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_1[2].subresourceRange.baseMipLevel = 0xc;
    mipLevelAndArrayRemainingRangeCases_1[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_1[0].subresourceRange.levelCount = dVar3;
    mipLevelAndArrayRemainingRangeCases_1[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_1[0].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_1[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_1[2].subresourceRange.aspectMask = VVar2;
    mipLevelRangeCases_1[0].subresourceRange.levelCount = dVar3;
    mipLevelRangeCases_1[1].subresourceRange.levelCount = dVar3;
    do {
      for (local_afc = 0; local_afc < 2; local_afc = local_afc + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_4.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_afc;
        pcStack_c98 = *(char **)&arrayRangeCases_1[lVar5 + 2].subresourceRange.baseArrayLayer;
        config_4.name = mipLevelRangeCases_1[lVar5].name;
        config_4.samplerLod = mipLevelRangeCases_1[lVar5].samplerLod;
        config_4.subresourceRange.aspectMask =
             mipLevelRangeCases_1[lVar5].subresourceRange.aspectMask;
        config_4.subresourceRange.baseMipLevel =
             mipLevelRangeCases_1[lVar5].subresourceRange.baseMipLevel;
        config_4.subresourceRange.levelCount =
             mipLevelRangeCases_1[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_4.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_4.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_4.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_c98;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                   config_4.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_4.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_5);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_4.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_cc0 = 0; local_cc0 < 3; local_cc0 = local_cc0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_5.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_cc0;
        pcStack_e58 = *(char **)&mipLevelAndArrayRangeCases_1[lVar5 + 5].subresourceRange.
                                 baseArrayLayer;
        config_5.name = arrayRangeCases_1[lVar5].name;
        config_5.samplerLod = arrayRangeCases_1[lVar5].samplerLod;
        config_5.subresourceRange.aspectMask = arrayRangeCases_1[lVar5].subresourceRange.aspectMask;
        config_5.subresourceRange.baseMipLevel =
             arrayRangeCases_1[lVar5].subresourceRange.baseMipLevel;
        config_5.subresourceRange.levelCount = arrayRangeCases_1[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_5.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_5.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_5.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_e58;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                   config_5.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_5.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_6);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_5.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_e80 = 0; local_e80 < 6; local_e80 = local_e80 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_6.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_e80;
        pcStack_1018 = *(char **)&mipLevelAndArrayRemainingRangeCases_1[lVar5 + 2].subresourceRange.
                                  baseArrayLayer;
        config_6.name = mipLevelAndArrayRangeCases_1[lVar5].name;
        config_6.samplerLod = mipLevelAndArrayRangeCases_1[lVar5].samplerLod;
        config_6.subresourceRange.aspectMask =
             mipLevelAndArrayRangeCases_1[lVar5].subresourceRange.aspectMask;
        config_6.subresourceRange.baseMipLevel =
             mipLevelAndArrayRangeCases_1[lVar5].subresourceRange.baseMipLevel;
        config_6.subresourceRange.levelCount =
             mipLevelAndArrayRangeCases_1[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_6.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_6.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_6.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1018;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                   config_6.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_6.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_7);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_6.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_1040 = 0; local_1040 < 3; local_1040 = local_1040 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_7.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_1040;
        pcStack_11d8 = *(char **)&mipLevelAndArrayRemainingRangeCases_1[lVar5 + -1].subresourceRange
                                  .baseArrayLayer;
        config_7.name = mipLevelAndArrayRemainingRangeCases_1[lVar5].name;
        config_7.samplerLod = mipLevelAndArrayRemainingRangeCases_1[lVar5].samplerLod;
        config_7.subresourceRange.aspectMask =
             mipLevelAndArrayRemainingRangeCases_1[lVar5].subresourceRange.aspectMask;
        config_7.subresourceRange.baseMipLevel =
             mipLevelAndArrayRemainingRangeCases_1[lVar5].subresourceRange.baseMipLevel;
        config_7.subresourceRange.levelCount =
             mipLevelAndArrayRemainingRangeCases_1[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_7.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_7.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_7.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_11d8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,imageFormat,
                   config_7.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_7.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string(local_11f8);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_7.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  else if ((viewType == VK_IMAGE_VIEW_TYPE_1D) || (viewType == VK_IMAGE_VIEW_TYPE_2D)) {
    arrayRangeCases_2[1].subresourceRange._12_8_ = anon_var_dwarf_3f09cb;
    mipLevelRangeCases_2[0].name._0_4_ = 0;
    mipLevelRangeCases_2[0].name._4_4_ = 1;
    mipLevelRangeCases_2[0].samplerLod = 2.8026e-45;
    mipLevelRangeCases_2[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelRangeCases_2[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_2[0].subresourceRange.levelCount = 1;
    mipLevelRangeCases_2[0].subresourceRange._12_8_ = anon_var_dwarf_3f09e2;
    mipLevelRangeCases_2[1].name._0_4_ = 0x40800000;
    mipLevelRangeCases_2[1].name._4_4_ = 1;
    mipLevelRangeCases_2[1].samplerLod = 0.0;
    mipLevelRangeCases_2[1].subresourceRange.aspectMask = 3;
    mipLevelRangeCases_2[1].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_2[1].subresourceRange.levelCount = 1;
    mipLevelAndArrayRangeCases_2[3].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_layer_second" + 0x13;
    arrayRangeCases_2[0].name._0_4_ = 0;
    arrayRangeCases_2[0].name._4_4_ = 1;
    arrayRangeCases_2[0].samplerLod = 0.0;
    arrayRangeCases_2[0].subresourceRange.baseMipLevel = 1;
    arrayRangeCases_2[0].subresourceRange.levelCount = 1;
    arrayRangeCases_2[0].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_layer_last" + 0x13;
    arrayRangeCases_2[1].name._0_4_ = 0;
    arrayRangeCases_2[1].name._4_4_ = 1;
    arrayRangeCases_2[1].samplerLod = 0.0;
    arrayRangeCases_2[1].subresourceRange.baseMipLevel = dVar3 - 1;
    arrayRangeCases_2[1].subresourceRange.levelCount = 1;
    mipLevelAndArrayRemainingRangeCases_2[2].subresourceRange._12_8_ = anon_var_dwarf_3f0b21;
    mipLevelAndArrayRangeCases_2[0].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_2[0].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_2[0].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_2[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_2[0].subresourceRange.baseMipLevel = 1;
    mipLevelAndArrayRangeCases_2[0].subresourceRange.levelCount = 1;
    mipLevelAndArrayRangeCases_2[0].subresourceRange._12_8_ = anon_var_dwarf_3f0b38;
    mipLevelAndArrayRangeCases_2[1].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_2[1].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_2[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_2[1].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_2[1].subresourceRange.baseMipLevel = dVar3 - 1;
    mipLevelAndArrayRangeCases_2[1].subresourceRange.levelCount = 1;
    mipLevelAndArrayRangeCases_2[1].subresourceRange._12_8_ = anon_var_dwarf_3f0b43;
    mipLevelAndArrayRangeCases_2[2].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_2[2].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_2[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_2[2].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_2[2].subresourceRange.baseMipLevel = 5;
    mipLevelAndArrayRangeCases_2[2].subresourceRange.levelCount = 1;
    mipLevelAndArrayRangeCases_2[2].subresourceRange._12_8_ = anon_var_dwarf_3f0b4e;
    mipLevelAndArrayRangeCases_2[3].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_2[3].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_2[3].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_2[3].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_2[3].subresourceRange.baseMipLevel = dVar3 - 1;
    mipLevelAndArrayRangeCases_2[3].subresourceRange.levelCount = 1;
    mipLevelAndArrayRemainingRangeCases_2[0].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_2[0].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_2[0].samplerLod = 1.4013e-45;
    mipLevelAndArrayRemainingRangeCases_2[0].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_2[0].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_2[0].subresourceRange.levelCount = 1;
    mipLevelAndArrayRemainingRangeCases_2[0].subresourceRange._12_8_ = anon_var_dwarf_3f0b59;
    mipLevelAndArrayRemainingRangeCases_2[1].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_2[1].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_2[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases_2[1].subresourceRange.baseMipLevel = dVar3 - 1;
    mipLevelAndArrayRemainingRangeCases_2[1].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_2[1].subresourceRange._12_8_ = anon_var_dwarf_3f0b64;
    mipLevelAndArrayRemainingRangeCases_2[2].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_2[2].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_2[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRemainingRangeCases_2[2].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_2[2].subresourceRange.baseMipLevel = dVar3 - 1;
    mipLevelAndArrayRemainingRangeCases_2[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_2[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_2[0].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_2[1].subresourceRange.aspectMask = VVar2;
    do {
      for (local_136c = 0; local_136c < 2; local_136c = local_136c + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_8.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_136c;
        pcStack_1508 = *(char **)&arrayRangeCases_2[lVar5 + 1].subresourceRange.baseArrayLayer;
        config_8.name = mipLevelRangeCases_2[lVar5].name;
        config_8.samplerLod = mipLevelRangeCases_2[lVar5].samplerLod;
        config_8.subresourceRange.aspectMask =
             mipLevelRangeCases_2[lVar5].subresourceRange.aspectMask;
        config_8.subresourceRange.baseMipLevel =
             mipLevelRangeCases_2[lVar5].subresourceRange.baseMipLevel;
        config_8.subresourceRange.levelCount =
             mipLevelRangeCases_2[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_8.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_8.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_8.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1508;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_8.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_8.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_9);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_8.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_1530 = 0; local_1530 < 2; local_1530 = local_1530 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_9.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_1530;
        pcStack_16c8 = *(char **)&mipLevelAndArrayRangeCases_2[lVar5 + 3].subresourceRange.
                                  baseArrayLayer;
        config_9.name = arrayRangeCases_2[lVar5].name;
        config_9.samplerLod = arrayRangeCases_2[lVar5].samplerLod;
        config_9.subresourceRange.aspectMask = arrayRangeCases_2[lVar5].subresourceRange.aspectMask;
        config_9.subresourceRange.baseMipLevel =
             arrayRangeCases_2[lVar5].subresourceRange.baseMipLevel;
        config_9.subresourceRange.levelCount = arrayRangeCases_2[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_9.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_9.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_9.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_16c8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_9.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_9.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_10);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_9.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_16f0 = 0; local_16f0 < 4; local_16f0 = local_16f0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_10.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_16f0;
        pcStack_1888 = *(char **)&mipLevelAndArrayRemainingRangeCases_2[lVar5 + 2].subresourceRange.
                                  baseArrayLayer;
        config_10.name = mipLevelAndArrayRangeCases_2[lVar5].name;
        config_10.samplerLod = mipLevelAndArrayRangeCases_2[lVar5].samplerLod;
        config_10.subresourceRange.aspectMask =
             mipLevelAndArrayRangeCases_2[lVar5].subresourceRange.aspectMask;
        config_10.subresourceRange.baseMipLevel =
             mipLevelAndArrayRangeCases_2[lVar5].subresourceRange.baseMipLevel;
        config_10.subresourceRange.levelCount =
             mipLevelAndArrayRangeCases_2[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_10.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_10.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_10.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1888;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_10.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_10.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_11);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_10.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_18b0 = 0; local_18b0 < 3; local_18b0 = local_18b0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_11.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_18b0;
        pcStack_1a48 = *(char **)&mipLevelAndArrayRemainingRangeCases_2[lVar5 + -1].subresourceRange
                                  .baseArrayLayer;
        config_11.name = mipLevelAndArrayRemainingRangeCases_2[lVar5].name;
        config_11.samplerLod = mipLevelAndArrayRemainingRangeCases_2[lVar5].samplerLod;
        config_11.subresourceRange.aspectMask =
             mipLevelAndArrayRemainingRangeCases_2[lVar5].subresourceRange.aspectMask;
        config_11.subresourceRange.baseMipLevel =
             mipLevelAndArrayRemainingRangeCases_2[lVar5].subresourceRange.baseMipLevel;
        config_11.subresourceRange.levelCount =
             mipLevelAndArrayRemainingRangeCases_2[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_11.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_11.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_11.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1a48;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,viewType,imageFormat,config_11.name._0_4_,
                   (VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_11.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string(local_1a68);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_11.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE) {
    arrayRangeCases_3[1].subresourceRange._12_8_ = anon_var_dwarf_3f09cb;
    mipLevelRangeCases_3[0].name._0_4_ = 0;
    mipLevelRangeCases_3[0].name._4_4_ = 1;
    mipLevelRangeCases_3[0].samplerLod = 2.8026e-45;
    mipLevelRangeCases_3[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelRangeCases_3[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_3[0].subresourceRange.levelCount = 6;
    mipLevelRangeCases_3[0].subresourceRange._12_8_ = anon_var_dwarf_3f09e2;
    mipLevelRangeCases_3[1].name._0_4_ = 0x40800000;
    mipLevelRangeCases_3[1].name._4_4_ = 1;
    mipLevelRangeCases_3[1].samplerLod = 0.0;
    mipLevelRangeCases_3[1].subresourceRange.aspectMask = 3;
    mipLevelRangeCases_3[1].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_3[1].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_3[3].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_layer_second" + 0x13;
    arrayRangeCases_3[0].name._0_4_ = 0;
    arrayRangeCases_3[0].name._4_4_ = 1;
    arrayRangeCases_3[0].samplerLod = 0.0;
    arrayRangeCases_3[0].subresourceRange.baseMipLevel = 6;
    arrayRangeCases_3[0].subresourceRange.levelCount = 6;
    arrayRangeCases_3[0].subresourceRange._12_8_ =
         (long)"lod_base_mip_level_array_layer_last" + 0x13;
    arrayRangeCases_3[1].name._0_4_ = 0;
    arrayRangeCases_3[1].name._4_4_ = 1;
    arrayRangeCases_3[1].samplerLod = 0.0;
    arrayRangeCases_3[1].subresourceRange.baseMipLevel = dVar3 - 6;
    arrayRangeCases_3[1].subresourceRange.levelCount = 6;
    mipLevelAndArrayRemainingRangeCases_3[2].subresourceRange._12_8_ = anon_var_dwarf_3f0b21;
    mipLevelAndArrayRangeCases_3[0].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_3[0].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_3[0].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_3[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_3[0].subresourceRange.baseMipLevel = 6;
    mipLevelAndArrayRangeCases_3[0].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_3[0].subresourceRange._12_8_ = anon_var_dwarf_3f0b38;
    mipLevelAndArrayRangeCases_3[1].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_3[1].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_3[1].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_3[1].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_3[1].subresourceRange.baseMipLevel = 6;
    mipLevelAndArrayRangeCases_3[1].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_3[1].subresourceRange._12_8_ = anon_var_dwarf_3f0b43;
    mipLevelAndArrayRangeCases_3[2].name._0_4_ = 0;
    mipLevelAndArrayRangeCases_3[2].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_3[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRangeCases_3[2].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelAndArrayRangeCases_3[2].subresourceRange.baseMipLevel = dVar3 - 6;
    mipLevelAndArrayRangeCases_3[2].subresourceRange.levelCount = 6;
    mipLevelAndArrayRangeCases_3[2].subresourceRange._12_8_ = anon_var_dwarf_3f0b4e;
    mipLevelAndArrayRangeCases_3[3].name._0_4_ = 0x40800000;
    mipLevelAndArrayRangeCases_3[3].name._4_4_ = 1;
    mipLevelAndArrayRangeCases_3[3].samplerLod = 0.0;
    mipLevelAndArrayRangeCases_3[3].subresourceRange.aspectMask = 3;
    mipLevelAndArrayRangeCases_3[3].subresourceRange.baseMipLevel = dVar3 - 6;
    mipLevelAndArrayRangeCases_3[3].subresourceRange.levelCount = 6;
    mipLevelAndArrayRemainingRangeCases_3[0].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_3[0].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_3[0].samplerLod = 1.4013e-45;
    mipLevelAndArrayRemainingRangeCases_3[0].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_3[0].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_3[0].subresourceRange.levelCount = 6;
    mipLevelAndArrayRemainingRangeCases_3[0].subresourceRange._12_8_ = anon_var_dwarf_3f0b59;
    mipLevelAndArrayRemainingRangeCases_3[1].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_3[1].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_3[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases_3[1].subresourceRange.baseMipLevel = dVar3 - 6;
    mipLevelAndArrayRemainingRangeCases_3[1].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_3[1].subresourceRange._12_8_ = anon_var_dwarf_3f0b64;
    mipLevelAndArrayRemainingRangeCases_3[2].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_3[2].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_3[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRemainingRangeCases_3[2].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_3[2].subresourceRange.baseMipLevel = dVar3 - 6;
    mipLevelAndArrayRemainingRangeCases_3[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_3[1].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_3[0].subresourceRange.aspectMask = VVar2;
    arrayRangeCases_3[1].subresourceRange.aspectMask = VVar2;
    do {
      for (local_1bdc = 0; local_1bdc < 2; local_1bdc = local_1bdc + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_12.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_1bdc;
        pcStack_1d78 = *(char **)&arrayRangeCases_3[lVar5 + 1].subresourceRange.baseArrayLayer;
        config_12.name = mipLevelRangeCases_3[lVar5].name;
        config_12.samplerLod = mipLevelRangeCases_3[lVar5].samplerLod;
        config_12.subresourceRange.aspectMask =
             mipLevelRangeCases_3[lVar5].subresourceRange.aspectMask;
        config_12.subresourceRange.baseMipLevel =
             mipLevelRangeCases_3[lVar5].subresourceRange.baseMipLevel;
        config_12.subresourceRange.levelCount =
             mipLevelRangeCases_3[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_12.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_12.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_12.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1d78;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                   config_12.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_12.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_13);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_12.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_1da0 = 0; local_1da0 < 2; local_1da0 = local_1da0 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_13.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_1da0;
        pcStack_1f38 = *(char **)&mipLevelAndArrayRangeCases_3[lVar5 + 3].subresourceRange.
                                  baseArrayLayer;
        config_13.name = arrayRangeCases_3[lVar5].name;
        config_13.samplerLod = arrayRangeCases_3[lVar5].samplerLod;
        config_13.subresourceRange.aspectMask = arrayRangeCases_3[lVar5].subresourceRange.aspectMask
        ;
        config_13.subresourceRange.baseMipLevel =
             arrayRangeCases_3[lVar5].subresourceRange.baseMipLevel;
        config_13.subresourceRange.levelCount = arrayRangeCases_3[lVar5].subresourceRange.levelCount
        ;
        poVar6 = std::operator<<((ostream *)&config_13.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_13.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_13.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_1f38;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                   config_13.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_13.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_14);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_13.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_1f60 = 0; local_1f60 < 4; local_1f60 = local_1f60 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_14.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_1f60;
        pcStack_20f8 = *(char **)&mipLevelAndArrayRemainingRangeCases_3[lVar5 + 2].subresourceRange.
                                  baseArrayLayer;
        config_14.name = mipLevelAndArrayRangeCases_3[lVar5].name;
        config_14.samplerLod = mipLevelAndArrayRangeCases_3[lVar5].samplerLod;
        config_14.subresourceRange.aspectMask =
             mipLevelAndArrayRangeCases_3[lVar5].subresourceRange.aspectMask;
        config_14.subresourceRange.baseMipLevel =
             mipLevelAndArrayRangeCases_3[lVar5].subresourceRange.baseMipLevel;
        config_14.subresourceRange.levelCount =
             mipLevelAndArrayRangeCases_3[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_14.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_14.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_14.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_20f8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                   config_14.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_14.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_15);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_14.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_2120 = 0; local_2120 < 3; local_2120 = local_2120 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_15.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_2120;
        pcStack_22b8 = *(char **)&mipLevelAndArrayRemainingRangeCases_3[lVar5 + -1].subresourceRange
                                  .baseArrayLayer;
        config_15.name = mipLevelAndArrayRemainingRangeCases_3[lVar5].name;
        config_15.samplerLod = mipLevelAndArrayRemainingRangeCases_3[lVar5].samplerLod;
        config_15.subresourceRange.aspectMask =
             mipLevelAndArrayRemainingRangeCases_3[lVar5].subresourceRange.aspectMask;
        config_15.subresourceRange.baseMipLevel =
             mipLevelAndArrayRemainingRangeCases_3[lVar5].subresourceRange.baseMipLevel;
        config_15.subresourceRange.levelCount =
             mipLevelAndArrayRemainingRangeCases_3[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_15.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_15.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_15.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_22b8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_CUBE,imageFormat,
                   config_15.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_15.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string(local_22d8);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_15.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  else if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
    mipLevelAndArrayRemainingRangeCases_4[2].subresourceRange._12_8_ = anon_var_dwarf_3f09cb;
    mipLevelRangeCases_4[0].name._0_4_ = 0;
    mipLevelRangeCases_4[0].name._4_4_ = 1;
    mipLevelRangeCases_4[0].samplerLod = 2.8026e-45;
    mipLevelRangeCases_4[0].subresourceRange.aspectMask = VVar2 - 2;
    mipLevelRangeCases_4[0].subresourceRange.baseMipLevel = 0;
    mipLevelRangeCases_4[0].subresourceRange._12_8_ = anon_var_dwarf_3f09e2;
    mipLevelRangeCases_4[1].name._0_4_ = 0x40800000;
    mipLevelRangeCases_4[1].name._4_4_ = 1;
    mipLevelRangeCases_4[1].samplerLod = 0.0;
    mipLevelRangeCases_4[1].subresourceRange.aspectMask = 3;
    mipLevelRangeCases_4[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_4[0].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_4[0].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_4[0].samplerLod = 1.4013e-45;
    mipLevelAndArrayRemainingRangeCases_4[0].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_4[0].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_4[0].subresourceRange._12_8_ = anon_var_dwarf_3f0b6f;
    mipLevelAndArrayRemainingRangeCases_4[1].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_4[1].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_4[1].samplerLod = 0.0;
    mipLevelAndArrayRemainingRangeCases_4[1].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_4[1].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_4[1].subresourceRange._12_8_ = anon_var_dwarf_3f0b7a;
    mipLevelAndArrayRemainingRangeCases_4[2].name._0_4_ = 0;
    mipLevelAndArrayRemainingRangeCases_4[2].name._4_4_ = 1;
    mipLevelAndArrayRemainingRangeCases_4[2].samplerLod = 2.8026e-45;
    mipLevelAndArrayRemainingRangeCases_4[2].subresourceRange.aspectMask = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_4[2].subresourceRange.baseMipLevel = 0;
    mipLevelAndArrayRemainingRangeCases_4[2].subresourceRange.levelCount = 0xffffffff;
    mipLevelAndArrayRemainingRangeCases_4[0].subresourceRange.levelCount = dVar3;
    mipLevelAndArrayRemainingRangeCases_4[1].subresourceRange.aspectMask = VVar2;
    mipLevelRangeCases_4[0].subresourceRange.levelCount = dVar3;
    mipLevelRangeCases_4[1].subresourceRange.levelCount = dVar3;
    do {
      for (local_238c = 0; local_238c < 2; local_238c = local_238c + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_16.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_238c;
        pcStack_2528 = *(char **)&mipLevelAndArrayRemainingRangeCases_4[lVar5 + 2].subresourceRange.
                                  baseArrayLayer;
        config_16.name = mipLevelRangeCases_4[lVar5].name;
        config_16.samplerLod = mipLevelRangeCases_4[lVar5].samplerLod;
        config_16.subresourceRange.aspectMask =
             mipLevelRangeCases_4[lVar5].subresourceRange.aspectMask;
        config_16.subresourceRange.baseMipLevel =
             mipLevelRangeCases_4[lVar5].subresourceRange.baseMipLevel;
        config_16.subresourceRange.levelCount =
             mipLevelRangeCases_4[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_16.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_16.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_16.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_2528;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_3D,imageFormat,
                   config_16.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_16.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)&configNdx_17);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_16.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      for (local_2550 = 0; local_2550 < 3; local_2550 = local_2550 + 1) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&config_17.subresourceRange.baseArrayLayer);
        lVar5 = (long)local_2550;
        pcStack_26e8 = *(char **)&mipLevelAndArrayRemainingRangeCases_4[lVar5 + -1].subresourceRange
                                  .baseArrayLayer;
        config_17.name = mipLevelAndArrayRemainingRangeCases_4[lVar5].name;
        config_17.samplerLod = mipLevelAndArrayRemainingRangeCases_4[lVar5].samplerLod;
        config_17.subresourceRange.aspectMask =
             mipLevelAndArrayRemainingRangeCases_4[lVar5].subresourceRange.aspectMask;
        config_17.subresourceRange.baseMipLevel =
             mipLevelAndArrayRemainingRangeCases_4[lVar5].subresourceRange.baseMipLevel;
        config_17.subresourceRange.levelCount =
             mipLevelAndArrayRemainingRangeCases_4[lVar5].subresourceRange.levelCount;
        poVar6 = std::operator<<((ostream *)&config_17.subresourceRange.baseArrayLayer,
                                 "Samples level ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,config_17.name._0_4_);
        poVar6 = std::operator<<(poVar6," with :\n");
        ::vk::operator<<(poVar6,(VkImageSubresourceRange *)((long)&config_17.name + 4));
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->(&__return_storage_ptr__->
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            )->super_TestNode;
        pIVar8 = (ImageViewTest *)operator_new(0xa0);
        pcVar1 = pcStack_26e8;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        ImageViewTest::ImageViewTest
                  (pIVar8,testCtx,pcVar1,pcVar9,VK_IMAGE_VIEW_TYPE_3D,imageFormat,
                   config_17.name._0_4_,(VkComponentMapping *)auStack_48,
                   (VkImageSubresourceRange *)((long)&config_17.name + 4));
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string(local_2708);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&config_17.subresourceRange.baseArrayLayer);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<tcu::TestCaseGroup> createSubresourceRangeTests(tcu::TestContext& testCtx, VkImageViewType viewType, VkFormat imageFormat)
{
	struct TestCaseConfig
	{
		const char*				name;
		float					samplerLod;
		VkImageSubresourceRange	subresourceRange;
	};

	const deUint32				numLevels				= ImageViewTest::getNumLevels(viewType);
	const deUint32				arraySize				= ImageViewTest::getArraySize(viewType);
	const VkImageAspectFlags	imageAspectFlags		= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkComponentMapping	componentMapping		= { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A };

	de::MovePtr<tcu::TestCaseGroup> rangeTests (new tcu::TestCaseGroup(testCtx, "subresource_range", ""));

#define ADD_SUBRESOURCE_RANGE_TESTS(TEST_CASES)															\
	do {																								\
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(TEST_CASES); configNdx++)				\
		{																								\
			std::ostringstream		desc;																\
			const TestCaseConfig	config	= (TEST_CASES)[configNdx];									\
			desc << "Samples level " << config.samplerLod << " with :\n" << config.subresourceRange;	\
			rangeTests->addChild(new ImageViewTest(testCtx, config.name, desc.str().c_str(), viewType,	\
												   imageFormat, config.samplerLod, componentMapping,	\
												   config.subresourceRange));							\
		}																								\
	} while (deGetFalse())

	if (viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY || viewType == VK_IMAGE_VIEW_TYPE_2D_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, arraySize - 1u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 4u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 1u, 5u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 1u, 5u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 4u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 4u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 2u, 3u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 2u, 3u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	2u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "base_array_layer",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, arraySize - 6u } },
			{ "array_size",				0.0f,			{ imageAspectFlags, 0u, numLevels, 0u, 6u } },
			{ "array_base_and_size",	0.0f,			{ imageAspectFlags, 0u, numLevels, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name										samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_base_array_layer",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 6u, arraySize - 6u } },
			{ "lod_mip_levels_base_array_layer",			4.0f,			{ imageAspectFlags, 0u, 3u, 6u, arraySize - 6u } },

			{ "lod_base_mip_level_array_size",				0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels_array_size",					4.0f,			{ imageAspectFlags, 0u, 3u, 0u, 6u } },

			{ "lod_base_mip_level_array_base_and_size",		0.0f,			{ imageAspectFlags, 2u, numLevels - 2u, 12u, 6u } },
			{ "lod_mip_levels_array_base_and_size",			4.0f,			{ imageAspectFlags, 0u, 3u, 12u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,		arraySize					} },
			{ "base_array_layer_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					6u,		VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_base_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	12u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_2D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 1u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 1u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 1u, 1u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 1u, 1u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 5u, 1u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 1u, 1u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				1u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 1u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_CUBE)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, 6u } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, 6u } },
		};

		const TestCaseConfig arrayRangeCases[] =
		{
			//	name					samplerLod		subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "array_layer_second",		0.0f,			{ imageAspectFlags, 0u, numLevels, 6u, 6u } },
			{ "array_layer_last",		0.0f,			{ imageAspectFlags, 0u, numLevels, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRangeCases[] =
		{
			//	name									samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_array_layer_second",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 6u, 6u } },
			{ "lod_mip_levels_array_layer_second",		4.0f,		{ imageAspectFlags, 0u, 3u, 6u, 6u } },

			{ "lod_base_mip_level_array_layer_last",	0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, arraySize - 6u, 6u } },
			{ "lod_mip_levels_array_layer_last",		4.0f,		{ imageAspectFlags, 0u, 3u, arraySize - 6u, 6u } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,				6u							} },
			{ "array_layer_last_remaining_layers",									0.0f,		{ imageAspectFlags,	0u,	numLevels,					arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_array_layer_last_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	arraySize - 6u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(arrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}
	else if (viewType == VK_IMAGE_VIEW_TYPE_3D)
	{
		const TestCaseConfig mipLevelRangeCases[] =
		{
			//	name					samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level",		0.0f,		{ imageAspectFlags, 2u, numLevels - 2u, 0u, arraySize } },
			{ "lod_mip_levels",			4.0f,		{ imageAspectFlags, 0u, 3u, 0u, arraySize } },
		};

		const TestCaseConfig mipLevelAndArrayRemainingRangeCases[] =
		{
			//	name																samplerLod	subresourceRange (aspectMask, baseMipLevel, mipLevels, baseArrayLayer, arraySize)
			{ "lod_base_mip_level_remaining_levels",								0.0f,		{ imageAspectFlags,	1u,	VK_REMAINING_MIP_LEVELS,	0u,	arraySize					} },
			{ "single_array_layer_remaining_layers",								0.0f,		{ imageAspectFlags,	0u,	numLevels,					0u,	VK_REMAINING_ARRAY_LAYERS	} },
			{ "lod_base_mip_level_single_array_layer_remaining_levels_and_layers",	0.0f,		{ imageAspectFlags,	2u,	VK_REMAINING_MIP_LEVELS,	0u,	VK_REMAINING_ARRAY_LAYERS	} },
		};

		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelRangeCases);
		ADD_SUBRESOURCE_RANGE_TESTS(mipLevelAndArrayRemainingRangeCases);
	}

#undef ADD_SUBRESOURCE_RANGE_TESTS

	return rangeTests;
}